

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O1

void rb_remove_node(lyd_meta *root_meta,rb_node **rbt,lyd_node *node,rb_node **removed)

{
  rb_node *prVar1;
  int iVar2;
  rb_node *rbn;
  rb_node *prVar3;
  rb_node *prVar4;
  uint8_t uVar5;
  long lVar6;
  rb_node **pprVar7;
  rb_node *prVar8;
  code *pcVar9;
  
  if (((root_meta == (lyd_meta *)0x0) || (rbt == (rb_node **)0x0)) || (node == (lyd_node *)0x0)) {
    __assert_fail("root_meta && rbt && node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0x3be,
                  "void rb_remove_node(struct lyd_meta *, struct rb_node **, struct lyd_node *, struct rb_node **)"
                 );
  }
  prVar3 = *rbt;
  if (prVar3 == (rb_node *)0x0) {
    return;
  }
  rbn = prVar3;
  if (prVar3->dnode != node) {
    pcVar9 = rb_compare_lists;
    if (prVar3->dnode->schema->nodetype == 8) {
      pcVar9 = rb_compare_leaflists;
    }
    do {
      iVar2 = (*pcVar9)(prVar3->dnode,node);
      lVar6 = 8;
      if ((iVar2 < 1) && (lVar6 = 0x10, -1 < iVar2)) {
        rbn = prVar3;
        if (prVar3->dnode == node) goto LAB_00157a9c;
        rbn = rb_prev(prVar3);
        goto joined_r0x00157bb8;
      }
      prVar3 = *(rb_node **)((long)&prVar3->parent + lVar6);
    } while (prVar3 != (rb_node *)0x0);
    goto LAB_00157a99;
  }
LAB_00157a9c:
  if (rbn != (rb_node *)0x0) {
    if (rbn->dnode != node) {
      __assert_fail("RBN_DNODE(rbn) == node",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                    ,0x3ca,
                    "void rb_remove_node(struct lyd_meta *, struct rb_node **, struct lyd_node *, struct rb_node **)"
                   );
    }
    prVar3 = rbn->right;
    prVar4 = prVar3;
    if ((rbn->left == (rb_node *)0x0) || (prVar4 = rbn->left, prVar3 == (rb_node *)0x0)) {
      prVar3 = rbn->parent;
      uVar5 = rbn->color;
      if (prVar4 != (rb_node *)0x0) {
        prVar4->parent = prVar3;
      }
      if (prVar3 == (rb_node *)0x0) {
        *rbt = prVar4;
        prVar3 = (rb_node *)0x0;
      }
      else if (prVar3->left == rbn) {
        prVar3->left = prVar4;
      }
      else {
        prVar3->right = prVar4;
      }
    }
    else {
      do {
        prVar8 = prVar3;
        prVar3 = prVar8->left;
      } while (prVar8->left != (rb_node *)0x0);
      prVar3 = prVar8->parent;
      prVar4 = prVar8->right;
      uVar5 = prVar8->color;
      if (prVar4 != (rb_node *)0x0) {
        prVar4->parent = prVar3;
      }
      pprVar7 = rbt;
      if (prVar3 != (rb_node *)0x0) {
        pprVar7 = &prVar3->right;
        if (prVar3->left == prVar8) {
          pprVar7 = &prVar3->left;
        }
      }
      *pprVar7 = prVar4;
      if (prVar8->parent == rbn) {
        prVar3 = prVar8;
      }
      prVar8->parent = rbn->parent;
      prVar8->left = rbn->left;
      prVar8->right = rbn->right;
      prVar8->color = rbn->color;
      prVar1 = rbn->parent;
      pprVar7 = rbt;
      if (prVar1 != (rb_node *)0x0) {
        pprVar7 = &prVar1->right;
        if (prVar1->left == rbn) {
          pprVar7 = &prVar1->left;
        }
      }
      *pprVar7 = prVar8;
      rbn->left->parent = prVar8;
      if (rbn->right != (rb_node *)0x0) {
        rbn->right->parent = prVar8;
      }
    }
    if (uVar5 == '\0') {
      do {
        if ((((prVar4 != (rb_node *)0x0) && (prVar4->color != '\0')) || (prVar4 == *rbt)) ||
           (prVar3 == (rb_node *)0x0)) goto LAB_00157dab;
        prVar8 = prVar3->left;
        if (prVar8 == prVar4) {
          prVar8 = prVar3->right;
          if (prVar8->color == '\x01') {
            prVar8->color = '\0';
            prVar3->color = '\x01';
            rb_rotate_left(rbt,prVar3);
            prVar8 = prVar3->right;
          }
          prVar4 = prVar8->left;
          if (((prVar4 != (rb_node *)0x0) && (prVar4->color != '\0')) ||
             ((prVar8->right != (rb_node *)0x0 && (prVar8->right->color != '\0')))) {
            if ((prVar8->right == (rb_node *)0x0) || (prVar8->right->color == '\0')) {
              if (prVar4 != (rb_node *)0x0) {
                prVar4->color = '\0';
              }
              prVar8->color = '\x01';
              rb_rotate_right(rbt,prVar8);
              prVar8 = prVar3->right;
            }
            prVar8->color = prVar3->color;
            prVar3->color = '\0';
            if (prVar8->right != (rb_node *)0x0) {
              prVar8->right->color = '\0';
            }
            rb_rotate_left(rbt,prVar3);
            goto LAB_00157da8;
          }
        }
        else {
          if (prVar8->color == '\x01') {
            prVar8->color = '\0';
            prVar3->color = '\x01';
            rb_rotate_right(rbt,prVar3);
            prVar8 = prVar3->left;
          }
          prVar4 = prVar8->left;
          if (((prVar4 != (rb_node *)0x0) && (prVar4->color != '\0')) ||
             ((prVar8->right != (rb_node *)0x0 && (prVar8->right->color != '\0'))))
          goto LAB_00157d06;
        }
        prVar8->color = '\x01';
        prVar4 = prVar3;
        prVar3 = prVar3->parent;
      } while( true );
    }
LAB_00157db4:
    *removed = rbn;
    if (rbn == *rbt) {
      *rbt = (rb_node *)0x0;
    }
    (root_meta->value).field_2.enum_item = (lysc_type_bitenum_item *)*rbt;
  }
  return;
joined_r0x00157bb8:
  if ((rbn == (rb_node *)0x0) || (iVar2 = (*pcVar9)(rbn->dnode,node), iVar2 != 0))
  goto LAB_00157be5;
  if (rbn->dnode == node) goto LAB_00157a9c;
  rbn = rb_prev(rbn);
  goto joined_r0x00157bb8;
LAB_00157be5:
  prVar3 = rb_next(prVar3);
  if (prVar3 == (rb_node *)0x0) {
LAB_00157a99:
    rbn = (rb_node *)0x0;
  }
  else {
    do {
      iVar2 = (*pcVar9)(prVar3->dnode,node);
      rbn = (rb_node *)0x0;
      if ((iVar2 != 0) || (rbn = prVar3, prVar3->dnode == node)) break;
      prVar3 = rb_next(prVar3);
      rbn = (rb_node *)0x0;
    } while (prVar3 != (rb_node *)0x0);
  }
  goto LAB_00157a9c;
LAB_00157d06:
  if ((prVar4 == (rb_node *)0x0) || (prVar4->color == '\0')) {
    if (prVar8->right != (rb_node *)0x0) {
      prVar8->right->color = '\0';
    }
    prVar8->color = '\x01';
    rb_rotate_left(rbt,prVar8);
    prVar8 = prVar3->left;
  }
  prVar8->color = prVar3->color;
  prVar3->color = '\0';
  if (prVar8->left != (rb_node *)0x0) {
    prVar8->left->color = '\0';
  }
  rb_rotate_right(rbt,prVar3);
LAB_00157da8:
  prVar4 = *rbt;
LAB_00157dab:
  if (prVar4 != (rb_node *)0x0) {
    prVar4->color = '\0';
  }
  goto LAB_00157db4;
}

Assistant:

static void
rb_remove_node(struct lyd_meta *root_meta, struct rb_node **rbt, struct lyd_node *node, struct rb_node **removed)
{
    struct rb_node *rbn;

    assert(root_meta && rbt && node);

    if (!*rbt) {
        return;
    }

    /* find @p node in the Red-black tree. */
    rbn = rb_find(*rbt, node);
    if (!rbn) {
        /* node was not inserted to the lyds tree due to optimization */
        return;
    }
    assert(RBN_DNODE(rbn) == node);

    /* remove node */
    rbn = rb_remove(rbt, rbn);
    *removed = rbn;
    if (rbn == *rbt) {
        /* rbn was the last node, assurance that root will be set to NULL */
        *rbt = NULL;
    }

    /* the root of the Red-black tree may changed due to removal, so update the pointer to the root */
    RBT_SET(root_meta, *rbt);
}